

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

void __thiscall
CollisionCallback<Blob<128>_>::operator()(CollisionCallback<Blob<128>_> *this,void *key,int len)

{
  size_type sVar1;
  mapped_type *__x;
  undefined4 in_EDX;
  undefined8 in_RSI;
  key_type *in_RDI;
  Blob<128> h;
  vector<ByteVec,_std::allocator<ByteVec>_> *this_00;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  void *in_stack_ffffffffffffffb8;
  ByteVec *in_stack_ffffffffffffffc0;
  key_type *in_stack_ffffffffffffffd8;
  map<Blob<128>,_std::vector<ByteVec,_std::allocator<ByteVec>_>,_std::less<Blob<128>_>,_std::allocator<std::pair<const_Blob<128>,_std::vector<ByteVec,_std::allocator<ByteVec>_>_>_>_>
  *in_stack_ffffffffffffffe0;
  
  Blob<128>::Blob((Blob<128> *)&stack0xffffffffffffffdc);
  (**(code **)in_RDI[1].bytes)(in_RSI,in_EDX,0,&stack0xffffffffffffffdc);
  sVar1 = std::set<Blob<128>,_std::less<Blob<128>_>,_std::allocator<Blob<128>_>_>::count
                    ((set<Blob<128>,_std::less<Blob<128>_>,_std::allocator<Blob<128>_>_> *)
                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_RDI);
  if (sVar1 != 0) {
    __x = std::
          map<Blob<128>,_std::vector<ByteVec,_std::allocator<ByteVec>_>,_std::less<Blob<128>_>,_std::allocator<std::pair<const_Blob<128>,_std::vector<ByteVec,_std::allocator<ByteVec>_>_>_>_>
          ::operator[](in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    this_00 = (vector<ByteVec,_std::allocator<ByteVec>_> *)&stack0xffffffffffffffc0;
    ByteVec::ByteVec(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
    std::vector<ByteVec,_std::allocator<ByteVec>_>::push_back(this_00,(value_type *)__x);
    ByteVec::~ByteVec((ByteVec *)0x1b9363);
  }
  return;
}

Assistant:

virtual void operator () ( const void * key, int len )
  {
    hashtype h;

    m_pfHash(key,len,0,&h);

    if(m_collisions.count(h))
    {
      m_collmap[h].push_back( ByteVec(key,len) );
    }
  }